

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit
          (Stack<rapidjson::CrtAllocator> *this)

{
  bool bVar1;
  size_t newCapacity;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  bVar1 = Empty(this);
  if (bVar1) {
    CrtAllocator::Free(this->stack_);
    this->stack_ = (char *)0x0;
    this->stackTop_ = (char *)0x0;
    this->stackEnd_ = (char *)0x0;
  }
  else {
    newCapacity = GetSize(this);
    Resize(this,newCapacity);
  }
  return;
}

Assistant:

void ShrinkToFit() { 
        if (Empty()) {
            // If the stack is empty, completely deallocate the memory.
            Allocator::Free(stack_);
            stack_ = 0;
            stackTop_ = 0;
            stackEnd_ = 0;
        }
        else
            Resize(GetSize());
    }